

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookptrcircularlist.h
# Opt level: O2

bool __thiscall cookmem::CircularList<Node>::contains(CircularList<Node> *this,Node *chunk)

{
  Node **ppNVar1;
  Node *pNVar2;
  Node *pNVar3;
  bool bVar4;
  
  pNVar2 = this->m_head;
  pNVar3 = pNVar2;
  if (pNVar2 == (Node *)0x0) {
    return false;
  }
  do {
    bVar4 = pNVar3 == chunk;
    if (bVar4) {
      return bVar4;
    }
    ppNVar1 = &pNVar3->next;
    pNVar3 = *ppNVar1;
  } while (*ppNVar1 != pNVar2);
  return bVar4;
}

Assistant:

bool
    contains (Node* chunk)
    {
        if (m_head == nullptr)
        {
            return false;
        }
        Node* node = m_head;
        do
        {
            if (node == chunk)
            {
                return true;
            }
            node = node->next;
        }
        while (node != m_head);
        return false;
    }